

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::AYPortHandler::Joystick::did_set_input(Joystick *this,Input *input,bool is_active)

{
  byte local_1a;
  uint8_t mask;
  bool is_active_local;
  Input *input_local;
  Joystick *this_local;
  
  switch(input->type) {
  case Up:
    local_1a = 1;
    break;
  case Down:
    local_1a = 2;
    break;
  case Left:
    local_1a = 4;
    break;
  case Right:
    local_1a = 8;
    break;
  default:
    return;
  case Fire:
    if (1 < (ulong)input->info) {
      return;
    }
    local_1a = 0x10;
    if (input->info != (Info)0x0) {
      local_1a = 0x20;
    }
  }
  if (is_active) {
    this->state_ = this->state_ & (local_1a ^ 0xff);
  }
  else {
    this->state_ = this->state_ | local_1a;
  }
  return;
}

Assistant:

void did_set_input(const Input &input, bool is_active) final {
					uint8_t mask = 0;
					switch(input.type) {
						default: return;
						case Input::Up:		mask = 0x01;	break;
						case Input::Down:	mask = 0x02;	break;
						case Input::Left:	mask = 0x04;	break;
						case Input::Right:	mask = 0x08;	break;
						case Input::Fire:
							if(input.info.control.index >= 2) return;
							mask = input.info.control.index ? 0x20 : 0x10;
						break;
					}

					if(is_active) state_ &= ~mask; else state_ |= mask;
				}